

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rct.cpp
# Opt level: O1

String * Rct::backtrace(String *__return_storage_ptr__,int maxFrames)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  void *__ptr;
  char *pcVar3;
  char *pcVar4;
  void *__ptr_00;
  char *__s;
  void *pvVar5;
  ulong uVar6;
  size_t sVar7;
  uint uVar8;
  int status;
  char buf [1024];
  char frame [1024];
  void *stack [1024];
  int local_284c;
  ulong local_2848;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2840;
  undefined1 local_2838 [1024];
  char local_2438 [1024];
  undefined1 local_2038 [8200];
  ulong uVar9;
  
  iVar2 = ::backtrace(local_2038,0x400);
  if (iVar2 < 1) {
    String::String(__return_storage_ptr__,"Couldn\'t get stack trace",0xffffffffffffffff);
  }
  else {
    paVar1 = &(__return_storage_ptr__->mString).field_2;
    (__return_storage_ptr__->mString)._M_dataplus._M_p = (pointer)paVar1;
    (__return_storage_ptr__->mString)._M_string_length = 0;
    (__return_storage_ptr__->mString).field_2._M_local_buf[0] = '\0';
    __ptr = (void *)backtrace_symbols(local_2038,iVar2);
    if (__ptr != (void *)0x0) {
      local_2840 = paVar1;
      if (maxFrames != 0 && iVar2 != 1) {
        uVar8 = iVar2 - 2U;
        if (maxFrames - 1U < iVar2 - 2U) {
          uVar8 = maxFrames - 1U;
        }
        uVar9 = (ulong)(uVar8 + 2);
        uVar6 = 1;
        local_2848 = uVar9;
        do {
          pcVar4 = *(char **)((long)__ptr + uVar6 * 8);
          if (pcVar4 == (char *)0x0) {
LAB_001602e7:
            __ptr_00 = (void *)0x0;
          }
          else {
            pcVar3 = strchr(pcVar4,0x28);
            __s = pcVar3 + 1;
            if (pcVar3 == (char *)0x0) {
              __s = pcVar4;
            }
            pcVar4 = strchr(__s,0x2b);
            if (pcVar4 == (char *)0x0) {
              sVar7 = strlen(__s);
            }
            else {
              sVar7 = (long)pcVar4 - (long)__s;
            }
            if (sVar7 < 0x400) {
              memcpy(local_2838,__s,sVar7 + 1);
              local_2838[sVar7] = 0;
              __ptr_00 = (void *)__cxa_demangle(local_2838,0,0,&local_284c);
              uVar9 = local_2848;
              if (local_284c != 0) {
                if (__ptr_00 != (void *)0x0) {
                  free(__ptr_00);
                }
                goto LAB_001602e7;
              }
            }
            else {
              __ptr_00 = (void *)0x0;
              uVar9 = local_2848;
            }
          }
          pvVar5 = __ptr_00;
          if (__ptr_00 == (void *)0x0) {
            pvVar5 = *(void **)((long)__ptr + uVar6 * 8);
          }
          snprintf(local_2438,0x400,"%d/%d %s\n",uVar6 & 0xffffffff,(ulong)(iVar2 - 1),pvVar5);
          std::__cxx11::string::append((char *)__return_storage_ptr__);
          if (__ptr_00 != (void *)0x0) {
            free(__ptr_00);
          }
          uVar6 = uVar6 + 1;
        } while (uVar9 != uVar6);
      }
      free(__ptr);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String backtrace(int maxFrames)
{
    enum { SIZE = 1024 };
    void *stack[SIZE];

    const int frameCount = backtrace(stack, sizeof(stack) / sizeof(void*));
    if (frameCount <= 0)
        return String("Couldn't get stack trace");
    String ret;
    char **symbols = backtrace_symbols(stack, frameCount);
    if (symbols) {
        char frame[1024];
        for (int i=1; i<frameCount && (maxFrames < 0 || i - 1 < maxFrames); ++i) {
            char *demangled = demangle(symbols[i]);
            snprintf(frame, sizeof(frame), "%d/%d %s\n", i, frameCount - 1, demangled ? demangled : symbols[i]);
            ret += frame;
            if (demangled)
                free(demangled);
        }
        free(symbols);
    }
    return ret;
}